

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *this_01;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&local_40,"CMAKE_NINJA_DEPTYPE_",lang);
  psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar2 == 0) {
    return true;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar2 == 0) {
    this_01 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    bVar1 = cmGlobalNinjaGenerator::SupportsMultilineDepfile(this_01);
    if (!bVar1) {
      return true;
    }
    psVar3 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    lVar4 = std::__cxx11::string::find((char)psVar3,0x20);
    if (lVar4 != -1) {
      return true;
    }
    psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    lVar4 = std::__cxx11::string::find((char)psVar3,0x20);
    if (lVar4 != -1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  std::string const& deptype =
    this->GetMakefile()->GetSafeDefinition("CMAKE_NINJA_DEPTYPE_" + lang);
  if (deptype == "msvc") {
    return true;
  }
  if (deptype == "intel") {
    // Ninja does not really define "intel", but we use it to switch based
    // on whether this environment supports "gcc" or "msvc" deptype.
    if (!this->GetGlobalGenerator()->SupportsMultilineDepfile()) {
      // This ninja version is too old to support the Intel depfile format.
      // Fall back to msvc deptype.
      return true;
    }
    if ((this->Makefile->GetHomeDirectory().find(' ') != std::string::npos) ||
        (this->Makefile->GetHomeOutputDirectory().find(' ') !=
         std::string::npos)) {
      // The Intel compiler does not properly escape spaces in a depfile.
      // Fall back to msvc deptype.
      return true;
    }
  }
  return false;
}